

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::FindBlocks<unsigned_short,520>
               (unsigned_short *data,size_t length,double block_switch_bitcost,
               vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *vec,
               uint8_t *block_id)

{
  ushort uVar1;
  byte bVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  void *__s;
  void *__s_00;
  void *__s_01;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t byte_ix;
  void *pvVar9;
  size_t j;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar3 = ((long)(vec->
                 super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x830;
  if (uVar3 < 2) {
    for (sVar4 = 0; length != sVar4; sVar4 = sVar4 + 1) {
      block_id[sVar4] = '\0';
    }
    return;
  }
  if (uVar3 < 0x101) {
    __s = operator_new__(uVar3 * 0x1040);
    memset(__s,0,uVar3 * 0x1040);
    lVar6 = 0x104;
    for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      dVar12 = FastLog2((ulong)((vec->
                                super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->data_[lVar6 * 2]);
      *(double *)((long)__s + uVar10 * 8) = dVar12;
      lVar6 = lVar6 + 0x106;
    }
    pvVar9 = (void *)(uVar3 * 0x1038 + (long)__s);
    lVar6 = 0x208;
    lVar7 = 0x81c;
    while (bVar11 = lVar6 != 0, lVar6 = lVar6 + -1, bVar11) {
      lVar8 = lVar7;
      for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
        dVar12 = *(double *)((long)__s + uVar10 * 8);
        dVar13 = BitCost((ulong)*(uint *)((long)((vec->
                                                 super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data_
                                         + lVar8));
        *(double *)((long)pvVar9 + uVar10 * 8) = dVar12 - dVar13;
        lVar8 = lVar8 + 0x830;
      }
      lVar7 = lVar7 + -4;
      pvVar9 = (void *)((long)pvVar9 + uVar3 * -8);
    }
    __s_00 = operator_new__(uVar3 * 8);
    memset(__s_00,0,uVar3 * 8);
    __s_01 = operator_new__(uVar3 * length);
    memset(__s_01,0,uVar3 * length);
    pvVar9 = __s_01;
    for (uVar10 = 0; uVar10 != length; uVar10 = uVar10 + 1) {
      uVar1 = data[uVar10];
      dVar12 = 1e+99;
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        dVar13 = *(double *)((long)__s + uVar5 * 8 + uVar1 * uVar3 * 8) +
                 *(double *)((long)__s_00 + uVar5 * 8);
        *(double *)((long)__s_00 + uVar5 * 8) = dVar13;
        if (dVar13 < dVar12) {
          block_id[uVar10] = (uint8_t)uVar5;
          dVar12 = dVar13;
        }
      }
      dVar13 = block_switch_bitcost;
      if (uVar10 < 2000) {
        dVar13 = (((double)(long)uVar10 * 0.07) / 2000.0 + 0.77) * block_switch_bitcost;
      }
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        dVar14 = *(double *)((long)__s_00 + uVar5 * 8) - dVar12;
        *(double *)((long)__s_00 + uVar5 * 8) = dVar14;
        if (dVar13 <= dVar14) {
          *(double *)((long)__s_00 + uVar5 * 8) = dVar13;
          *(undefined1 *)((long)pvVar9 + uVar5) = 1;
        }
      }
      pvVar9 = (void *)((long)pvVar9 + uVar3);
    }
    bVar2 = block_id[length - 1];
    pvVar9 = (void *)((long)__s_01 + (length - 2) * uVar3);
    for (; length != 1; length = length - 1) {
      if (*(char *)((long)pvVar9 + (ulong)bVar2) == '\x01') {
        bVar2 = block_id[length - 2];
      }
      block_id[length - 2] = bVar2;
      pvVar9 = (void *)((long)pvVar9 - uVar3);
    }
    operator_delete__(__s);
    operator_delete__(__s_00);
    operator_delete__(__s_01);
    return;
  }
  __assert_fail("vecsize <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/block_splitter.cc"
                ,0xac,
                "void brotli::FindBlocks(const DataType *, const size_t, const double, const std::vector<Histogram<kSize>> &, uint8_t *) [DataType = unsigned short, kSize = 520]"
               );
}

Assistant:

void FindBlocks(const DataType* data, const size_t length,
                const double block_switch_bitcost,
                const std::vector<Histogram<kSize> > &vec,
                uint8_t *block_id) {
  if (vec.size() <= 1) {
    for (size_t i = 0; i < length; ++i) {
      block_id[i] = 0;
    }
    return;
  }
  size_t vecsize = vec.size();
  assert(vecsize <= 256);
  double* insert_cost = new double[kSize * vecsize];
  memset(insert_cost, 0, sizeof(insert_cost[0]) * kSize * vecsize);
  for (size_t j = 0; j < vecsize; ++j) {
    insert_cost[j] = FastLog2(static_cast<uint32_t>(vec[j].total_count_));
  }
  for (size_t i = kSize; i != 0;) {
    --i;
    for (size_t j = 0; j < vecsize; ++j) {
      insert_cost[i * vecsize + j] = insert_cost[j] - BitCost(vec[j].data_[i]);
    }
  }
  double *cost = new double[vecsize];
  memset(cost, 0, sizeof(cost[0]) * vecsize);
  bool* switch_signal = new bool[length * vecsize];
  memset(switch_signal, 0, sizeof(switch_signal[0]) * length * vecsize);
  // After each iteration of this loop, cost[k] will contain the difference
  // between the minimum cost of arriving at the current byte position using
  // entropy code k, and the minimum cost of arriving at the current byte
  // position. This difference is capped at the block switch cost, and if it
  // reaches block switch cost, it means that when we trace back from the last
  // position, we need to switch here.
  for (size_t byte_ix = 0; byte_ix < length; ++byte_ix) {
    size_t ix = byte_ix * vecsize;
    size_t insert_cost_ix = data[byte_ix] * vecsize;
    double min_cost = 1e99;
    for (size_t k = 0; k < vecsize; ++k) {
      // We are coding the symbol in data[byte_ix] with entropy code k.
      cost[k] += insert_cost[insert_cost_ix + k];
      if (cost[k] < min_cost) {
        min_cost = cost[k];
        block_id[byte_ix] = static_cast<uint8_t>(k);
      }
    }
    double block_switch_cost = block_switch_bitcost;
    // More blocks for the beginning.
    if (byte_ix < 2000) {
      block_switch_cost *= 0.77 + 0.07 * static_cast<double>(byte_ix) / 2000;
    }
    for (size_t k = 0; k < vecsize; ++k) {
      cost[k] -= min_cost;
      if (cost[k] >= block_switch_cost) {
        cost[k] = block_switch_cost;
        switch_signal[ix + k] = true;
      }
    }
  }
  // Now trace back from the last position and switch at the marked places.
  size_t byte_ix = length - 1;
  size_t ix = byte_ix * vecsize;
  uint8_t cur_id = block_id[byte_ix];
  while (byte_ix > 0) {
    --byte_ix;
    ix -= vecsize;
    if (switch_signal[ix + cur_id]) {
      cur_id = block_id[byte_ix];
    }
    block_id[byte_ix] = cur_id;
  }
  delete[] insert_cost;
  delete[] cost;
  delete[] switch_signal;
}